

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_script.cpp
# Opt level: O0

RPCHelpMan * getdescriptorinfo(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  string EXAMPLE_DESCRIPTOR;
  allocator<RPCResult> *in_stack_fffffffffffff208;
  uint uVar1;
  allocator<RPCResult> *this;
  RPCArg *this_00;
  anon_class_1_0_00000001 *in_stack_fffffffffffff210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff240;
  allocator<char> *in_stack_fffffffffffff248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff250;
  undefined7 in_stack_fffffffffffff258;
  undefined1 in_stack_fffffffffffff25f;
  string *in_stack_fffffffffffff260;
  undefined7 in_stack_fffffffffffff268;
  undefined1 in_stack_fffffffffffff26f;
  undefined4 in_stack_fffffffffffff270;
  Type in_stack_fffffffffffff274;
  string *in_stack_fffffffffffff278;
  undefined4 in_stack_fffffffffffff280;
  Type in_stack_fffffffffffff284;
  undefined4 in_stack_fffffffffffff288;
  Type in_stack_fffffffffffff28c;
  RPCResult *in_stack_fffffffffffff290;
  undefined1 *local_d60;
  undefined1 *local_d48;
  undefined1 *local_d30;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_01;
  RPCMethodImpl *in_stack_fffffffffffff470;
  undefined1 local_b70 [38];
  allocator<char> local_b4a [2];
  pointer local_b48;
  pointer pRStack_b40;
  pointer local_b38;
  allocator<char> local_b2a;
  allocator<char> local_b29 [31];
  allocator<char> local_b0a;
  allocator<char> local_b09 [31];
  allocator<char> local_aea;
  undefined1 local_ae9 [30];
  undefined1 local_acb;
  undefined1 local_aca [2];
  size_type local_ac8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_ac0;
  allocator<char> local_aaa;
  allocator<char> local_aa9 [31];
  allocator<char> local_a8a;
  allocator<char> local_a89;
  pointer local_a88;
  pointer pbStack_a80;
  pointer local_a78;
  allocator<char> local_a62;
  allocator<char> local_a61 [31];
  allocator<char> local_a42;
  allocator<char> local_a41 [32];
  allocator<char> local_a21;
  undefined4 local_a20;
  allocator<char> local_a19 [30];
  allocator<char> local_9fb;
  allocator<char> local_9fa;
  allocator<char> local_9f9 [673];
  undefined1 local_758 [136];
  undefined1 local_6d0 [128];
  undefined1 local_650 [272];
  string local_540 [17];
  undefined1 local_320 [200];
  undefined1 local_258;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined1 local_218;
  undefined1 local_217;
  undefined1 local_170 [264];
  undefined1 local_68 [96];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::~allocator(local_9f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  local_a20 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff218,(Optional *)in_stack_fffffffffffff210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  local_258 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff220);
  local_230 = 0;
  uStack_228 = 0;
  local_220 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff208);
  local_218 = 0;
  local_217 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
                 in_stack_fffffffffffff278,in_stack_fffffffffffff274,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff26f,in_stack_fffffffffffff268),
                 in_stack_fffffffffffff260,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258));
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff208);
  __l._M_len._0_7_ = in_stack_fffffffffffff258;
  __l._M_array = (iterator)in_stack_fffffffffffff250;
  __l._M_len._7_1_ = in_stack_fffffffffffff25f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff248,__l,
             (allocator_type *)in_stack_fffffffffffff240);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  local_a88 = (pointer)0x0;
  pbStack_a80 = (pointer)0x0;
  local_a78 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff208);
  RPCResult::RPCResult
            (in_stack_fffffffffffff290,in_stack_fffffffffffff28c,
             (string *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
             in_stack_fffffffffffff278,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
             (bool)in_stack_fffffffffffff26f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  local_ac8 = 0;
  aStack_ac0._M_allocated_capacity = 0;
  aStack_ac0._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff208);
  RPCResult::RPCResult
            (in_stack_fffffffffffff290,in_stack_fffffffffffff28c,
             (string *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
             in_stack_fffffffffffff278,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
             (bool)in_stack_fffffffffffff26f);
  this_01 = (RPCHelpMan *)(local_aca + 1);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff208);
  uVar1 = (uint)((ulong)in_stack_fffffffffffff208 >> 0x20);
  __l_00._M_len._0_7_ = in_stack_fffffffffffff258;
  __l_00._M_array = (iterator)in_stack_fffffffffffff250;
  __l_00._M_len._7_1_ = in_stack_fffffffffffff25f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff248,__l_00,
             (allocator_type *)in_stack_fffffffffffff240);
  this = (allocator<RPCResult> *)((ulong)uVar1 << 0x20);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),
             in_stack_fffffffffffff284,in_stack_fffffffffffff278,
             SUB41(in_stack_fffffffffffff274 >> 0x18,0),
             (string *)CONCAT17(in_stack_fffffffffffff26f,in_stack_fffffffffffff268),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff260,
             (bool)in_stack_fffffffffffff25f);
  description = local_540;
  name = (string *)local_aca;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_acb;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  local_ae9._1_8_ = 0;
  local_ae9._9_8_ = 0;
  local_ae9._17_8_ = 0;
  results = (RPCResults *)(local_ae9 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            (in_stack_fffffffffffff290,in_stack_fffffffffffff28c,
             (string *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
             in_stack_fffffffffffff278,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
             (bool)in_stack_fffffffffffff26f);
  examples = (RPCExamples *)local_ae9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  local_b09[1] = (allocator<char>)0x0;
  local_b09[2] = (allocator<char>)0x0;
  local_b09[3] = (allocator<char>)0x0;
  local_b09[4] = (allocator<char>)0x0;
  local_b09[5] = (allocator<char>)0x0;
  local_b09[6] = (allocator<char>)0x0;
  local_b09[7] = (allocator<char>)0x0;
  local_b09[8] = (allocator<char>)0x0;
  local_b09[9] = (allocator<char>)0x0;
  local_b09[10] = (allocator<char>)0x0;
  local_b09[0xb] = (allocator<char>)0x0;
  local_b09[0xc] = (allocator<char>)0x0;
  local_b09[0xd] = (allocator<char>)0x0;
  local_b09[0xe] = (allocator<char>)0x0;
  local_b09[0xf] = (allocator<char>)0x0;
  local_b09[0x10] = (allocator<char>)0x0;
  local_b09[0x11] = (allocator<char>)0x0;
  local_b09[0x12] = (allocator<char>)0x0;
  local_b09[0x13] = (allocator<char>)0x0;
  local_b09[0x14] = (allocator<char>)0x0;
  local_b09[0x15] = (allocator<char>)0x0;
  local_b09[0x16] = (allocator<char>)0x0;
  local_b09[0x17] = (allocator<char>)0x0;
  local_b09[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            (in_stack_fffffffffffff290,in_stack_fffffffffffff28c,
             (string *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
             in_stack_fffffffffffff278,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
             (bool)in_stack_fffffffffffff26f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  local_b29[1] = (allocator<char>)0x0;
  local_b29[2] = (allocator<char>)0x0;
  local_b29[3] = (allocator<char>)0x0;
  local_b29[4] = (allocator<char>)0x0;
  local_b29[5] = (allocator<char>)0x0;
  local_b29[6] = (allocator<char>)0x0;
  local_b29[7] = (allocator<char>)0x0;
  local_b29[8] = (allocator<char>)0x0;
  local_b29[9] = (allocator<char>)0x0;
  local_b29[10] = (allocator<char>)0x0;
  local_b29[0xb] = (allocator<char>)0x0;
  local_b29[0xc] = (allocator<char>)0x0;
  local_b29[0xd] = (allocator<char>)0x0;
  local_b29[0xe] = (allocator<char>)0x0;
  local_b29[0xf] = (allocator<char>)0x0;
  local_b29[0x10] = (allocator<char>)0x0;
  local_b29[0x11] = (allocator<char>)0x0;
  local_b29[0x12] = (allocator<char>)0x0;
  local_b29[0x13] = (allocator<char>)0x0;
  local_b29[0x14] = (allocator<char>)0x0;
  local_b29[0x15] = (allocator<char>)0x0;
  local_b29[0x16] = (allocator<char>)0x0;
  local_b29[0x17] = (allocator<char>)0x0;
  local_b29[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            (in_stack_fffffffffffff290,in_stack_fffffffffffff28c,
             (string *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
             in_stack_fffffffffffff278,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
             (bool)in_stack_fffffffffffff26f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  local_b48 = (pointer)0x0;
  pRStack_b40 = (pointer)0x0;
  local_b38 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            (in_stack_fffffffffffff290,in_stack_fffffffffffff28c,
             (string *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
             in_stack_fffffffffffff278,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
             (bool)in_stack_fffffffffffff26f);
  std::allocator<RPCResult>::allocator(this);
  __l_01._M_len._0_7_ = in_stack_fffffffffffff258;
  __l_01._M_array = (iterator)in_stack_fffffffffffff250;
  __l_01._M_len._7_1_ = in_stack_fffffffffffff25f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff248,__l_01,
             (allocator_type *)in_stack_fffffffffffff240);
  RPCResult::RPCResult
            (in_stack_fffffffffffff290,in_stack_fffffffffffff28c,
             (string *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280),
             in_stack_fffffffffffff278,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
             (bool)in_stack_fffffffffffff26f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),
             (RPCResult *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::operator+((char *)CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
                 in_stack_fffffffffffff250);
  std::operator+(in_stack_fffffffffffff220,(char *)in_stack_fffffffffffff218);
  HelpExampleCli(in_stack_fffffffffffff240,in_stack_fffffffffffff238);
  std::operator+((char *)in_stack_fffffffffffff220,in_stack_fffffffffffff218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
             (char *)in_stack_fffffffffffff250,in_stack_fffffffffffff248);
  std::operator+((char *)CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
                 in_stack_fffffffffffff250);
  std::operator+(in_stack_fffffffffffff220,(char *)in_stack_fffffffffffff218);
  HelpExampleRpc(in_stack_fffffffffffff240,in_stack_fffffffffffff238);
  std::operator+(in_stack_fffffffffffff240,in_stack_fffffffffffff238);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x139091b);
  this_00 = (RPCArg *)local_b70;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getdescriptorinfo()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff218,in_stack_fffffffffffff210);
  RPCHelpMan::RPCHelpMan(this_01,name,description,args,results,examples,in_stack_fffffffffffff470);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_b70 + 0x25));
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_b4a);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff218);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_d30 = local_320;
  do {
    local_d30 = local_d30 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_d30 != local_650);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff218);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_b2a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_b29);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff218);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_b0a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_b09);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff218);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_aea);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_ae9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff218);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_acb);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_aca);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff218);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_d48 = local_6d0;
  do {
    local_d48 = local_d48 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_d48 != local_758);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff218);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_aaa);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_aa9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_a8a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_a89);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff218);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_a62);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_a61);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_a42);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_a41);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff218);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  local_d60 = local_68;
  do {
    local_d60 = local_d60 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_d60 != local_170);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_a21);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_a19);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_9fb);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_9fa);
  std::__cxx11::string::~string(&this_00->m_names);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getdescriptorinfo()
{
    const std::string EXAMPLE_DESCRIPTOR = "wpkh([d34db33f/84h/0h/0h]0279be667ef9dcbbac55a06295Ce870b07029Bfcdb2dce28d959f2815b16f81798)";

    return RPCHelpMan{"getdescriptorinfo",
        {"\nAnalyses a descriptor.\n"},
        {
            {"descriptor", RPCArg::Type::STR, RPCArg::Optional::NO, "The descriptor."},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "descriptor", "The descriptor in canonical form, without private keys. For a multipath descriptor, only the first will be returned."},
                {RPCResult::Type::ARR, "multipath_expansion", /*optional=*/true, "All descriptors produced by expanding multipath derivation elements. Only if the provided descriptor specifies multipath derivation elements.",
                {
                    {RPCResult::Type::STR, "", ""},
                }},
                {RPCResult::Type::STR, "checksum", "The checksum for the input descriptor"},
                {RPCResult::Type::BOOL, "isrange", "Whether the descriptor is ranged"},
                {RPCResult::Type::BOOL, "issolvable", "Whether the descriptor is solvable"},
                {RPCResult::Type::BOOL, "hasprivatekeys", "Whether the input descriptor contained at least one private key"},
            }
        },
        RPCExamples{
            "Analyse a descriptor\n" +
            HelpExampleCli("getdescriptorinfo", "\"" + EXAMPLE_DESCRIPTOR + "\"") +
            HelpExampleRpc("getdescriptorinfo", "\"" + EXAMPLE_DESCRIPTOR + "\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            FlatSigningProvider provider;
            std::string error;
            auto descs = Parse(request.params[0].get_str(), provider, error);
            if (descs.empty()) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, error);
            }

            UniValue result(UniValue::VOBJ);
            result.pushKV("descriptor", descs.at(0)->ToString());

            if (descs.size() > 1) {
                UniValue multipath_descs(UniValue::VARR);
                for (const auto& d : descs) {
                    multipath_descs.push_back(d->ToString());
                }
                result.pushKV("multipath_expansion", multipath_descs);
            }

            result.pushKV("checksum", GetDescriptorChecksum(request.params[0].get_str()));
            result.pushKV("isrange", descs.at(0)->IsRange());
            result.pushKV("issolvable", descs.at(0)->IsSolvable());
            result.pushKV("hasprivatekeys", provider.keys.size() > 0);
            return result;
        },
    };
}